

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

int __thiscall
Validate::CheckIDDoesNotExceedMaxLimit(Validate *this,char *idName,longlong initialID)

{
  int iVar1;
  long extraout_RDX;
  char *pcVar2;
  Validate *this_00;
  undefined4 uVar3;
  
  if ((initialID < 0x80000000) && (this->MIN_ID_ <= initialID)) {
    return (int)initialID;
  }
  pcVar2 = 
  "ERROR: %s ID %lld on line %d does not lie within permitted range [%d, %d]. Please reassign %s IDs to lie within this range.\n"
  ;
  uVar3 = 0;
  fprintf(_stderr,
          "ERROR: %s ID %lld on line %d does not lie within permitted range [%d, %d]. Please reassign %s IDs to lie within this range.\n"
          ,idName,initialID,(ulong)(uint)this->lineno_,(ulong)(uint)this->MIN_ID_,0x7fffffff,idName)
  ;
  this_00 = this;
  PrintErrorMessage(this);
  if (0xffffffff00000000 < extraout_RDX - 0x100000000U) {
    return (int)extraout_RDX;
  }
  fprintf(_stderr,
          "ERROR: %s ID %lld on line %d does not lie within permitted range [%d, %u]. Please reassign %s IDs to lie within this range.\n"
          ,pcVar2,extraout_RDX,(ulong)(uint)this_00->lineno_,(ulong)(uint)this_00->MIN_ID_,
          CONCAT44(uVar3,0xffffffff),pcVar2,this);
  PrintErrorMessage(this_00);
  iVar1 = __isoc99_sscanf(this_00->line_ + 8,"%lld,%llu,%d,%f",this_00[1].line_ + 0x24,
                          this_00[1].line_ + 0x34,this_00[1].line_ + 0xe,this_00[1].line_ + 0x12);
  return iVar1;
}

Assistant:

int Validate::CheckIDDoesNotExceedMaxLimit(char *idName, long long initialID) {
/* Check ID does not exceed maximum value for integers. */

  if (initialID < MIN_ID_ || initialID > INT_MAX) {

    fprintf(stderr, "ERROR: %s ID %lld on line %d does not lie within"
		    " permitted range [%d, %d]. Please reassign %s IDs to lie"
		    " within this range.\n",
		    idName, initialID, lineno_, MIN_ID_, INT_MAX, idName);
    PrintErrorMessage();

  }

  return (int)initialID;

}